

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall
polyscope::CurveNetwork::CurveNetwork
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *nodes_,vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  *edges_)

{
  ManagedBufferRegistry *registry_;
  undefined1 *this_00;
  pointer puVar1;
  pointer paVar2;
  ulong __val;
  ulong __val_00;
  pointer puVar3;
  pointer pvVar4;
  size_t __n;
  ulong __val_01;
  long lVar5;
  vec3 value_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_290;
  ulong local_288;
  string *local_280;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_278;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *local_270;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_268;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_260;
  ManagedBuffer<unsigned_int> *local_258;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_250;
  ManagedBuffer<unsigned_int> *local_248;
  string *local_240;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
  *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  function<void_()> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x950);
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x597b58;
  *(undefined8 *)&this->field_0x950 = 0x597bf8;
  local_240 = name;
  std::__cxx11::string::string((string *)&local_150,(string *)name);
  (*(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure[0xd])
            (&local_170,this);
  QuantityStructure<polyscope::CurveNetwork>::QuantityStructure
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,
             &PTR_construction_vtable_24__00597c10,&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x597b58;
  *(undefined8 *)&this->field_0x950 = 0x597bf8;
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"nodePositions");
  this_00 = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  registry_ = &(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure.
               super_ManagedBufferRegistry;
  local_250 = &this->nodePositionsData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,registry_,&local_2e0,
             local_250);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"edgeTailInds");
  local_248 = &this->edgeTailInds;
  local_2a0 = &this->edgeTailIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_248,registry_,&local_2e0,local_2a0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"edgeTipInds");
  local_258 = &this->edgeTipInds;
  local_290 = &this->edgeTipIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_258,registry_,&local_2e0,local_290);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"edgeCenters");
  local_230._M_dataplus._M_p = (pointer)computeEdgeCenters;
  local_230._M_string_length = 0;
  local_230.field_2._M_allocated_capacity = (size_type)this;
  std::function<void()>::
  function<std::_Bind<void(polyscope::CurveNetwork::*(polyscope::CurveNetwork*))()>,void>
            ((function<void()> *)&local_190,
             (_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()> *)&local_230);
  local_260 = &this->edgeCenters;
  local_268 = &this->edgeCentersData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_260,registry_,&local_2e0,local_268,&local_190);
  std::_Function_base::~_Function_base(&local_190.super__Function_base);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = &this->nodeDegrees;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar4 = (nodes_->
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (nodes_->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (nodes_->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (nodes_->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_2a0 + 2))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [64])local_2a0 = ZEXT464(0) << 0x40;
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"#color");
  value_ = getNextUniqueColor();
  local_270 = &this->color;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (local_270,&local_2e0,value_);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"#radius");
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            (&this->radius,&local_2e0,(ScaledValue<float>)0x3ba3d70a00000001);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  std::operator+(&local_2e0,&local_2c0,"#material");
  std::__cxx11::string::string((string *)&local_1b0,"clay",(allocator *)&local_230);
  local_278 = &this->material;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(local_278,&local_2e0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  local_280 = &this->nodeRadiusQuantityName;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_280,"",(allocator *)&local_2e0);
  this->nodeRadiusQuantityAutoscale = true;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_2a0,
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_290,
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  __n = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                  ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2e0,__n,
             (value_type_conflict1 *)&local_2c0,(allocator_type *)&local_230);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_298,&local_2e0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2e0);
  local_288 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                        ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  lVar5 = 8;
  __val_01 = 0;
  local_238 = edges_;
  while( true ) {
    paVar2 = (local_238->
             super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_238->
                      super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 4) <= __val_01)
    break;
    __val = *(ulong *)((long)paVar2->_M_elems + lVar5 + -8);
    __val_00 = *(ulong *)((long)paVar2->_M_elems + lVar5);
    (local_2a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start[__val_01] = (uint)__val;
    (local_290->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start[__val_01] = (uint)__val_00;
    if (local_288 <= __val || local_288 <= __val_00) {
      std::operator+(&local_b0,"CurveNetwork [",local_240);
      std::operator+(&local_210,&local_b0,"] edge ");
      std::__cxx11::to_string(&local_d0,__val_01);
      std::operator+(&local_90,&local_210,&local_d0);
      std::operator+(&local_1f0,&local_90," has bad node indices { ");
      std::__cxx11::to_string(&local_f0,__val);
      std::operator+(&local_70,&local_1f0,&local_f0);
      std::operator+(&local_1d0,&local_70," , ");
      std::__cxx11::to_string(&local_110,__val_00);
      std::operator+(&local_230,&local_1d0,&local_110);
      std::operator+(&local_2c0,&local_230," } but there are ");
      std::__cxx11::to_string(&local_130,local_288);
      std::operator+(&local_2e0,&local_2c0,&local_130);
      std::operator+(&local_50,&local_2e0," nodes.");
      exception(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    __val_01 = __val_01 + 1;
    lVar5 = lVar5 + 0x10;
    puVar3 = (local_298->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = puVar3 + __val;
    *puVar1 = *puVar1 + 1;
    puVar3 = puVar3 + __val_00;
    *puVar3 = *puVar3 + 1;
  }
  (*(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure[0x10])
            (this);
  return;
}

Assistant:

CurveNetwork::CurveNetwork(std::string name, std::vector<glm::vec3> nodes_, std::vector<std::array<size_t, 2>> edges_)
    : // clang-format off
      QuantityStructure<CurveNetwork>(name, typeName()), 
      nodePositions(this, uniquePrefix() + "nodePositions", nodePositionsData),
      edgeTailInds(this, uniquePrefix() + "edgeTailInds", edgeTailIndsData),
      edgeTipInds(this, uniquePrefix() + "edgeTipInds", edgeTipIndsData),
      edgeCenters(this, uniquePrefix() + "edgeCenters", edgeCentersData, std::bind(&CurveNetwork::computeEdgeCenters, this)),         
      nodePositionsData(std::move(nodes_)), 
      color(uniquePrefix() + "#color", getNextUniqueColor()), 
      radius(uniquePrefix() + "#radius", relativeValue(0.005)),
      material(uniquePrefix() + "#material", "clay")
// clang-format on
{

  // Copy interleaved data in to tip and tails buffers below
  edgeTailIndsData.resize(edges_.size());
  edgeTipIndsData.resize(edges_.size());

  // Compute node degrees; some quantities want them for visualizations
  nodeDegrees = std::vector<size_t>(nNodes(), 0);

  size_t maxInd = nodePositions.size();
  for (size_t iE = 0; iE < edges_.size(); iE++) {
    auto edge = edges_[iE];
    size_t nA = std::get<0>(edge);
    size_t nB = std::get<1>(edge);

    edgeTailIndsData[iE] = nA;
    edgeTipIndsData[iE] = nB;

    // Make sure there are no out of bounds indices
    if (nA >= maxInd || nB >= maxInd) {
      exception("CurveNetwork [" + name + "] edge " + std::to_string(iE) + " has bad node indices { " +
                std::to_string(nA) + " , " + std::to_string(nB) + " } but there are " + std::to_string(maxInd) +
                " nodes.");
    }

    // Increment degree
    nodeDegrees[nA]++;
    nodeDegrees[nB]++;
  }

  updateObjectSpaceBounds();
}